

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.H
# Opt level: O2

Array4<const_double> * __thiscall
amrex::MLLinOp::compactify<double_const>
          (Array4<const_double> *__return_storage_ptr__,MLLinOp *this,Array4<const_double> *a)

{
  int iVar1;
  Long LVar2;
  Long LVar3;
  Long LVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  double *pdVar10;
  Dim3 local_28;
  Dim3 local_18;
  
  iVar1 = (this->info).hidden_direction;
  if (iVar1 == 2) {
    pdVar10 = a->p;
    local_18.x = (a->begin).x;
    local_18.y = (a->begin).y;
    local_28.x = (a->end).x;
    local_28.y = (a->end).y;
  }
  else if (iVar1 == 1) {
    pdVar10 = a->p;
    local_18.y = (a->begin).z;
    local_18.x = (a->begin).x;
    local_28.y = (a->end).z;
    local_28.x = (a->end).x;
  }
  else {
    if (iVar1 != 0) {
      pdVar10 = a->p;
      LVar2 = a->jstride;
      LVar3 = a->kstride;
      LVar4 = a->nstride;
      iVar8 = (a->begin).x;
      iVar9 = (a->begin).y;
      uVar5 = *(undefined8 *)&(a->begin).z;
      iVar1 = (a->end).z;
      iVar6 = a->ncomp;
      uVar7 = *(undefined4 *)&a->field_0x3c;
      (__return_storage_ptr__->end).y = (a->end).y;
      (__return_storage_ptr__->end).z = iVar1;
      __return_storage_ptr__->ncomp = iVar6;
      *(undefined4 *)&__return_storage_ptr__->field_0x3c = uVar7;
      (__return_storage_ptr__->begin).x = iVar8;
      (__return_storage_ptr__->begin).y = iVar9;
      *(undefined8 *)&(__return_storage_ptr__->begin).z = uVar5;
      __return_storage_ptr__->kstride = LVar3;
      __return_storage_ptr__->nstride = LVar4;
      __return_storage_ptr__->p = pdVar10;
      __return_storage_ptr__->jstride = LVar2;
      return __return_storage_ptr__;
    }
    pdVar10 = a->p;
    local_18.x = (a->begin).y;
    local_18.y = (a->begin).z;
    local_28.x = (a->end).y;
    local_28.y = (a->end).z;
  }
  local_18.z = 0;
  local_28.z = 1;
  Array4<const_double>::Array4(__return_storage_ptr__,pdVar10,&local_18,&local_28,a->ncomp);
  return __return_storage_ptr__;
}

Assistant:

Array4<T> compactify (Array4<T> const& a) const noexcept
    {
        if (info.hidden_direction == 0) {
            return Array4<T>(a.dataPtr(), {a.begin.y,a.begin.z,0}, {a.end.y,a.end.z,1}, a.nComp());
        } else if (info.hidden_direction == 1) {
            return Array4<T>(a.dataPtr(), {a.begin.x,a.begin.z,0}, {a.end.x,a.end.z,1}, a.nComp());
        } else if (info.hidden_direction == 2) {
            return Array4<T>(a.dataPtr(), {a.begin.x,a.begin.y,0}, {a.end.x,a.end.y,1}, a.nComp());
        } else {
            return a;
        }
    }